

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

void __thiscall
lest::failure::failure(failure *this,location *where_,text *expr_,text *decomposition_)

{
  undefined8 *in_RDI;
  location *in_stack_fffffffffffffe78;
  location *in_stack_fffffffffffffe80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe88;
  allocator *paVar1;
  allocator local_141;
  char *in_stack_fffffffffffffec0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec8;
  text *in_stack_fffffffffffffee0;
  text *in_stack_fffffffffffffee8;
  location *in_stack_fffffffffffffef0;
  text *in_stack_fffffffffffffef8;
  message *in_stack_ffffffffffffff00;
  string local_e0 [32];
  string local_c0 [95];
  allocator local_61;
  string local_60 [32];
  string local_40 [64];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"failed",&local_61);
  std::__cxx11::string::string(local_40,local_60);
  location::location(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
  std::operator+(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  std::operator+(in_stack_fffffffffffffe88,&in_stack_fffffffffffffe80->file);
  std::__cxx11::string::string(local_c0,local_e0);
  paVar1 = &local_141;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&stack0xfffffffffffffec0,"",paVar1);
  std::__cxx11::string::string
            ((string *)&stack0xfffffffffffffee0,(string *)&stack0xfffffffffffffec0);
  message::message(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
                   in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffee0);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffec0);
  std::allocator<char>::~allocator((allocator<char> *)&local_141);
  std::__cxx11::string::~string(local_c0);
  std::__cxx11::string::~string(local_e0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff00);
  location::~location((location *)0x12ddab);
  std::__cxx11::string::~string(local_40);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  *in_RDI = &PTR__failure_0013cc50;
  return;
}

Assistant:

failure( location where_, text expr_, text decomposition_)
    : message( "failed", where_, expr_ + " for " + decomposition_) {}